

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_arm.c
# Opt level: O2

cpu_purpose_t cpuid_identify_purpose_arm(cpu_raw_data_t *raw)

{
  uint uVar1;
  int iVar2;
  arm_hw_impl *hw_impl;
  arm_id_part *paVar3;
  cpu_purpose_t cVar4;
  
  uVar1 = (uint)raw->arm_midr;
  hw_impl = get_cpu_implementer_from_code((uint8_t)(uVar1 >> 0x18));
  paVar3 = get_cpu_implementer_parts(hw_impl,(uint16_t)((uVar1 & 0xffff) >> 4));
  iVar2 = match_pattern(paVar3->name,"Cortex-X[012356789]");
  if (iVar2 == 0) {
    iVar2 = match_pattern(paVar3->name,"Cortex-A[67][012356789]");
    cVar4 = PURPOSE_PERFORMANCE;
    if ((iVar2 == 0) && (iVar2 = match_pattern(paVar3->name,"Cortex-A[5][6789]"), iVar2 == 0)) {
      iVar2 = match_pattern(paVar3->name,"Cortex-A[5][012345]");
      if (iVar2 == 0) {
        iVar2 = match_pattern(paVar3->name,"Cortex-A[3][0123456789]");
        cVar4 = (uint)(iVar2 != 0) * 2;
      }
      else {
        cVar4 = PURPOSE_EFFICIENCY;
      }
    }
  }
  else {
    cVar4 = PURPOSE_U_PERFORMANCE;
  }
  return cVar4;
}

Assistant:

cpu_purpose_t cpuid_identify_purpose_arm(struct cpu_raw_data_t* raw)
{
	const uint8_t implementer         = EXTRACTS_BITS(raw->arm_midr, 31, 24);
	const uint16_t part_num           = EXTRACTS_BITS(raw->arm_midr, 15,  4);
	const struct arm_hw_impl* hw_impl = get_cpu_implementer_from_code(implementer);
	const struct arm_id_part* id_part = get_cpu_implementer_parts(hw_impl, part_num);

	/* ARM big.LITTLE Typical Processor Combinations: https://www.arm.com/technologies/big-little */
	if (match_pattern(id_part->name, "Cortex-X[012356789]"))
		return PURPOSE_U_PERFORMANCE;
	else if (match_pattern(id_part->name, "Cortex-A[67][012356789]") || match_pattern(id_part->name, "Cortex-A[5][6789]"))
		return PURPOSE_PERFORMANCE;
	else if (match_pattern(id_part->name, "Cortex-A[5][012345]") || match_pattern(id_part->name, "Cortex-A[3][0123456789]"))
		return PURPOSE_EFFICIENCY;

	return PURPOSE_GENERAL;
}